

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.cpp
# Opt level: O3

double __thiscall chrono::ChNormalDistribution::GetRandom(ChNormalDistribution *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  double local_18;
  double local_10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  if (this->hasSpare == true) {
    this->hasSpare = false;
    local_10 = this->mean;
    dVar2 = this->variance * this->rand1;
    if (dVar2 < 0.0) {
      local_18 = sqrt(dVar2);
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar2;
      auVar4 = vsqrtsd_avx(auVar3,auVar3);
      local_18 = auVar4._0_8_;
    }
    auVar6._0_8_ = sin(this->rand2);
    auVar6._8_56_ = extraout_var_00;
    auVar4 = auVar6._0_16_;
  }
  else {
    this->hasSpare = true;
    auVar5._0_8_ = ChRandom();
    auVar5._8_56_ = extraout_var;
    auVar4 = vmaxsd_avx(ZEXT816(0x2b2bff2ee48e0530),auVar5._0_16_);
    dVar2 = log(auVar4._0_8_);
    this->rand1 = dVar2 * -2.0;
    dVar2 = ChRandom();
    this->rand2 = dVar2 * 6.283185307179586;
    local_10 = this->mean;
    dVar2 = this->variance * this->rand1;
    if (dVar2 < 0.0) {
      local_18 = sqrt(dVar2);
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar2;
      auVar4 = vsqrtsd_avx(auVar4,auVar4);
      local_18 = auVar4._0_8_;
    }
    auVar7._0_8_ = cos(this->rand2);
    auVar7._8_56_ = extraout_var_01;
    auVar4 = auVar7._0_16_;
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_18;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_10;
  auVar4 = vfmadd213sd_fma(auVar4,auVar8,auVar1);
  return auVar4._0_8_;
}

Assistant:

double ChNormalDistribution::GetRandom() {
    if (hasSpare) {
        hasSpare = false;
        return (mean + sqrt(variance * rand1) * sin(rand2));
    }

    hasSpare = true;

    rand1 = ::chrono::ChRandom();
    if (rand1 < 1e-100)
        rand1 = 1e-100;
    rand1 = -2.0 * log(rand1);
    rand2 = ::chrono::ChRandom() * CH_C_2PI;

    return (mean + sqrt(variance * rand1) * cos(rand2));
}